

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheRelease(PgHdr *p)

{
  short sVar1;
  PgHdr *p_local;
  
  p->pCache->nRefSum = p->pCache->nRefSum + -1;
  sVar1 = p->nRef + -1;
  p->nRef = sVar1;
  if (sVar1 == 0) {
    if ((p->flags & 1) == 0) {
      if (p->pDirtyPrev != (PgHdr *)0x0) {
        pcacheManageDirtyList(p,'\x03');
      }
    }
    else {
      pcacheUnpin(p);
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->pCache->nRefSum--;
  if( (--p->nRef)==0 ){
    if( p->flags&PGHDR_CLEAN ){
      pcacheUnpin(p);
    }else if( p->pDirtyPrev!=0 ){ /*OPTIMIZATION-IF-FALSE*/
      /* Move the page to the head of the dirty list. If p->pDirtyPrev==0,
      ** then page p is already at the head of the dirty list and the
      ** following call would be a no-op. Hence the OPTIMIZATION-IF-FALSE
      ** tag above.  */
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    }
  }
}